

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_ObjDead(FParser *this)

{
  AActor *pAVar1;
  int iVar2;
  
  if (this->t_argc == 0) {
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)&this->Script->trigger);
  }
  else {
    pAVar1 = actorvalue(this->t_argv);
  }
  (this->t_return).type = 1;
  if (pAVar1 != (AActor *)0x0) {
    iVar2 = 1;
    if ((pAVar1->health < 1) || (((pAVar1->flags).Value & 0x100000) != 0)) goto LAB_004f4d9c;
  }
  iVar2 = 0;
LAB_004f4d9c:
  (this->t_return).value.i = iVar2;
  return;
}

Assistant:

void FParser::SF_ObjDead()
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	t_return.type = svt_int;
	if(mo && (mo->health <= 0 || mo->flags&MF_CORPSE))
		t_return.value.i = 1;
	else
		t_return.value.i = 0;
}